

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

bool absl::ExactlyOneReader(intptr_t v)

{
  if (((uint)v & 9) != 1) {
    __assert_fail("(v & (kMuWriter | kMuReader)) == kMuReader",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x6d0,"bool absl::ExactlyOneReader(intptr_t)");
  }
  if (0xff < (ulong)v) {
    return (ulong)v < 0x200;
  }
  __assert_fail("(v & kMuHigh) != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x6d1,"bool absl::ExactlyOneReader(intptr_t)");
}

Assistant:

static bool ExactlyOneReader(intptr_t v) {
  assert((v & (kMuWriter | kMuReader)) == kMuReader);
  assert((v & kMuHigh) != 0);
  // The more straightforward "(v & kMuHigh) == kMuOne" also works, but
  // on some architectures the following generates slightly smaller code.
  // It may be faster too.
  constexpr intptr_t kMuMultipleWaitersMask = kMuHigh ^ kMuOne;
  return (v & kMuMultipleWaitersMask) == 0;
}